

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week3-app1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int product;
  int r2;
  int r1;
  int addition;
  Func func;
  char **argv_local;
  int argc_local;
  
  iVar1 = run(10,5,add);
  iVar2 = add(10,0x14);
  iVar3 = add(100,200,300);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  iVar2 = run(10,5,multiply);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
//    int(*func)(int, int);
    Func func;
    func = &add;

    int addition = run(10, 5, &add);

    int r1 = add(10, 20);
    int r2 = add(100, 200, 300);
    std::cout << r1 << std::endl;
    std::cout << r2 << std::endl;

//    int addition = add(10, 5);

    int product = run(10, 5, &multiply);
    std::cout << addition << std::endl;
    std::cout << product << std::endl;
    return 0;
}